

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void clear_bb_insn_dead_vars(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  dead_var_t_conflict pdVar1;
  dead_var_t pdVar2;
  MIR_context_t pMVar3;
  HTAB_MIR_item_t *pHVar4;
  long lVar5;
  MIR_item_t pMVar6;
  bitmap_t pVVar7;
  bb_t_conflict bb;
  DLIST_LINK_dead_var_t *pDVar8;
  DLIST_dead_var_t *pDVar9;
  char **ppcVar10;
  HTAB_MIR_item_t **ppHVar11;
  size_t *rpost;
  dead_var_t_conflict *ppdVar12;
  dead_var_t_conflict dv;
  gen_ctx_t __ptr;
  
  dv = (bb_insn->insn_dead_vars).head;
  if (dv != (dead_var_t_conflict)0x0) {
    ppdVar12 = &(bb_insn->insn_dead_vars).tail;
    __ptr = gen_ctx;
    do {
      pdVar1 = (dv->dead_var_link).prev;
      pDVar9 = (DLIST_dead_var_t *)&(pdVar1->dead_var_link).next;
      if (pdVar1 == (dead_var_t_conflict)0x0) {
        pDVar9 = &bb_insn->insn_dead_vars;
      }
      pDVar9->head = (dv->dead_var_link).next;
      pdVar2 = (dv->dead_var_link).next;
      if (pdVar2 == (dead_var_t)0x0) {
        pDVar8 = (DLIST_LINK_dead_var_t *)ppdVar12;
        if (*ppdVar12 != dv) {
          clear_bb_insn_dead_vars_cold_1();
          pdVar2 = (__ptr->free_dead_vars).tail;
          if (pdVar2 == (dead_var_t)0x0) {
            if ((__ptr->free_dead_vars).head == (dead_var_t_conflict)0x0) {
              pDVar9 = &__ptr->free_dead_vars;
              goto LAB_0015fe77;
            }
          }
          else {
            if ((pdVar2->dead_var_link).next == (dead_var_t)0x0) {
              pDVar9 = (DLIST_dead_var_t *)&(pdVar2->dead_var_link).next;
LAB_0015fe77:
              pDVar9->head = dv;
              (dv->dead_var_link).next = (dead_var_t)0x0;
              (dv->dead_var_link).prev = pdVar2;
              (__ptr->free_dead_vars).tail = dv;
              return;
            }
            free_dead_var_cold_1();
          }
          free_dead_var_cold_2();
          pMVar3 = __ptr->ctx;
          pHVar4 = *(HTAB_MIR_item_t **)&__ptr->debug_level;
          if (pHVar4 != (HTAB_MIR_item_t *)0x0) {
            pHVar4->free_func = (_func_void_MIR_item_t_void_ptr *)__ptr->to_free;
LAB_0015fec2:
            if (__ptr->to_free == (VARR_void_ptr_t *)0x0) {
              if ((gen_ctx_t)pMVar3->module_item_tab != __ptr) goto LAB_0015ff44;
              ppHVar11 = &pMVar3->module_item_tab;
            }
            else {
              ppHVar11 = (HTAB_MIR_item_t **)&__ptr->to_free[1].size;
            }
            *ppHVar11 = pHVar4;
            *(undefined8 *)&__ptr->debug_level = 0;
            __ptr->to_free = (VARR_void_ptr_t *)0x0;
            lVar5 = *(long *)&__ptr->optimize_level;
            pMVar6 = __ptr->curr_func_item;
            if (pMVar6 == (MIR_item_t)0x0) {
              if (*(gen_ctx_t *)(lVar5 + 0x30) != __ptr) goto LAB_0015ff49;
              *(FILE **)(lVar5 + 0x30) = __ptr->debug_file;
            }
            else {
              (pMVar6->item_link).next = (MIR_item_t)__ptr->debug_file;
            }
            if (__ptr->debug_file == (FILE *)0x0) {
              if (*(gen_ctx_t *)(lVar5 + 0x38) != __ptr) goto LAB_0015ff4e;
              ppcVar10 = (char **)(lVar5 + 0x38);
            }
            else {
              ppcVar10 = &__ptr->debug_file->_IO_read_end;
            }
            *ppcVar10 = (char *)pMVar6;
            __ptr->curr_func_item = (MIR_item_t)0x0;
            __ptr->debug_file = (FILE *)0x0;
            free(__ptr);
            return;
          }
          if ((gen_ctx_t)pMVar3->used_label_p == __ptr) {
            pMVar3->used_label_p = (VARR_uint8_t *)__ptr->to_free;
            goto LAB_0015fec2;
          }
          delete_edge_cold_1();
LAB_0015ff44:
          delete_edge_cold_2();
LAB_0015ff49:
          delete_edge_cold_3();
LAB_0015ff4e:
          delete_edge_cold_4();
          lVar5 = *(long *)dv;
          *(long *)dv = lVar5 + 1;
          *(long *)&__ptr->optimize_level = lVar5;
          for (pVVar7 = __ptr->addr_regs; pVVar7 != (bitmap_t)0x0; pVVar7 = (bitmap_t)pVVar7[1].varr
              ) {
            bb = (bb_t_conflict)pVVar7->size;
            if (bb->pre == 0) {
              DFS(bb,(size_t *)dv,rpost);
            }
            else if (bb->rpost == 0) {
              *(undefined1 *)((long)&pVVar7[2].els_num + 1) = 1;
            }
          }
          pMVar6 = (MIR_item_t)*rpost;
          *rpost = (size_t)((long)&pMVar6[-1].u + 7);
          __ptr->curr_func_item = pMVar6;
          return;
        }
      }
      else {
        pDVar8 = &pdVar2->dead_var_link;
      }
      pDVar8->prev = pdVar1;
      (dv->dead_var_link).prev = (dead_var_t)0x0;
      (dv->dead_var_link).next = (dead_var_t)0x0;
      __ptr = gen_ctx;
      free_dead_var(gen_ctx,dv);
      dv = (bb_insn->insn_dead_vars).head;
    } while (dv != (dead_var_t_conflict)0x0);
  }
  return;
}

Assistant:

static void clear_bb_insn_dead_vars (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  dead_var_t dv;

  while ((dv = DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars)) != NULL) {
    DLIST_REMOVE (dead_var_t, bb_insn->insn_dead_vars, dv);
    free_dead_var (gen_ctx, dv);
  }
}